

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::attachToDefaultFramebufferTest(TestContext *testCtx,Context *context)

{
  logComment(testCtx,"Attaching 2D texture to default framebuffer");
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,1,0);
  checkError(testCtx,context,0x502);
  logComment(testCtx,"Attaching renderbuffer to default framebuffer");
  (*context->_vptr_Context[0xc])(context,0x8d41,1);
  (*context->_vptr_Context[0x20])(context,0x8d40,0x8d00,0x8d41,1);
  checkError(testCtx,context,0x502);
  return;
}

Assistant:

static void attachToDefaultFramebufferTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	logComment(testCtx, "Attaching 2D texture to default framebuffer");

	deUint32 tex2D = 1;
	context.bindTexture(GL_TEXTURE_2D, tex2D);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching renderbuffer to default framebuffer");

	deUint32 rbo = 1;
	context.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}